

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O1

exr_result_t
internal_decode_alloc_buffer
          (exr_decode_pipeline_t *decode,exr_transcoding_pipeline_buffer_id_t bufid,void **buf,
          size_t *cursz,size_t newsz)

{
  int iVar1;
  exr_const_context_t p_Var2;
  bool bVar3;
  exr_result_t eVar4;
  void *pvVar5;
  void *pvVar6;
  
  eVar4 = 0;
  if ((newsz != 0) && ((pvVar5 = *buf, pvVar5 == (void *)0x0 || (*cursz < newsz)))) {
    internal_decode_free_buffer(decode,bufid,buf,cursz);
    if (decode->alloc_fn == (_func_void_ptr_exr_transcoding_pipeline_buffer_id_t_size_t *)0x0) {
      p_Var2 = decode->context;
      if (p_Var2 == (exr_const_context_t)0x0) {
        pvVar6 = (void *)0x2;
        bVar3 = false;
      }
      else if ((decode->part_index < 0) || (*(int *)(p_Var2 + 0xc4) <= decode->part_index)) {
        bVar3 = false;
        pvVar6 = (void *)(**(code **)(p_Var2 + 0x48))(p_Var2,4,"Part index (%d) out of range");
      }
      else {
        pvVar6 = (void *)(**(code **)(p_Var2 + 0x58))(newsz);
        bVar3 = true;
        pvVar5 = pvVar6;
      }
      if (!bVar3) {
        return (exr_result_t)pvVar6;
      }
    }
    else {
      pvVar5 = (*decode->alloc_fn)(bufid,newsz);
    }
    if (pvVar5 == (void *)0x0) {
      p_Var2 = decode->context;
      if (p_Var2 != (exr_const_context_t)0x0) {
        iVar1 = decode->part_index;
        if ((-1 < iVar1) && (iVar1 < *(int *)(p_Var2 + 0xc4))) {
          eVar4 = (**(code **)(p_Var2 + 0x48))
                            (p_Var2,1,"Unable to allocate %lu bytes",newsz,*(code **)(p_Var2 + 0x48)
                            );
          return eVar4;
        }
        eVar4 = (**(code **)(p_Var2 + 0x48))
                          (p_Var2,4,"Part index (%d) out of range",iVar1,*(code **)(p_Var2 + 0x48));
        return eVar4;
      }
      eVar4 = 2;
    }
    else {
      *buf = pvVar5;
      *cursz = newsz;
      eVar4 = 0;
    }
  }
  return eVar4;
}

Assistant:

exr_result_t
internal_decode_alloc_buffer (
    exr_decode_pipeline_t*               decode,
    exr_transcoding_pipeline_buffer_id_t bufid,
    void**                               buf,
    size_t*                              cursz,
    size_t                               newsz)
{
    void* curbuf = *buf;

    /* We might have a zero size here due to y sampling on a scanline
     * image where there is an attempt to read that portion of the
     * image. Just shortcut here and handle at a higher level where
     * there is more context
     */
    if (newsz == 0) return EXR_ERR_SUCCESS;

    if (!curbuf || *cursz < newsz)
    {
        internal_decode_free_buffer (decode, bufid, buf, cursz);

        if (decode->alloc_fn)
            curbuf = (uint8_t*) decode->alloc_fn (bufid, newsz);
        else
        {
            EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
                decode->context, decode->part_index);

            curbuf = (uint8_t*) pctxt->alloc_fn (newsz);
        }

        if (curbuf == NULL)
        {
            EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
                decode->context, decode->part_index);

            return pctxt->print_error (
                pctxt,
                EXR_ERR_OUT_OF_MEMORY,
                "Unable to allocate %" PRIu64 " bytes",
                (uint64_t) newsz);
        }

        *buf   = curbuf;
        *cursz = newsz;
    }
    return EXR_ERR_SUCCESS;
}